

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

Vec_Int_t * Abc_FrameDeriveStatusArray2(Vec_Ptr_t *vCexes)

{
  uint uVar1;
  void **ppvVar2;
  void *pvVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    pVVar4 = (Vec_Int_t *)0x0;
  }
  else {
    uVar1 = vCexes->nSize;
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    uVar7 = 0x10;
    if (0xe < uVar1 - 1) {
      uVar7 = uVar1;
    }
    pVVar4->nSize = 0;
    pVVar4->nCap = uVar7;
    if (uVar7 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar7 << 2);
    }
    lVar8 = (long)(int)uVar1;
    pVVar4->pArray = piVar5;
    if ((int)uVar7 < (int)uVar1) {
      if (piVar5 == (int *)0x0) {
        piVar5 = (int *)malloc(lVar8 * 4);
      }
      else {
        piVar5 = (int *)realloc(piVar5,lVar8 * 4);
      }
      pVVar4->pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      pVVar4->nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset(pVVar4->pArray,0xff,(ulong)uVar1 * 4);
    }
    pVVar4->nSize = uVar1;
    if (0 < vCexes->nSize) {
      lVar6 = 0;
      do {
        ppvVar2 = vCexes->pArray;
        pvVar3 = ppvVar2[lVar6];
        if (pvVar3 != (void *)0x0) {
          if (pvVar3 == (void *)0x1) {
            if (lVar8 <= lVar6) {
LAB_002475a4:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar4->pArray[lVar6] = 1;
            if (vCexes->nSize <= lVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                            ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
            }
            ppvVar2[lVar6] = (void *)0x0;
          }
          else {
            if (lVar8 <= lVar6) goto LAB_002475a4;
            pVVar4->pArray[lVar6] = 0;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < vCexes->nSize);
    }
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray2( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
        {
            Vec_IntWriteEntry( vStatuses, i, 1 ); // set this output as UNSAT
            Vec_PtrWriteEntry( vCexes, i, NULL );
        }
        else if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;
}